

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

bool __thiscall
Json::BuiltStyledStreamWriter::isMultilineArray(BuiltStyledStreamWriter *this,Value *value)

{
  _Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
  _Var1;
  ArrayIndex AVar2;
  ArrayIndex AVar3;
  Value *pVVar4;
  byte bVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  
  AVar2 = Value::size(value);
  bVar9 = this->rightMargin_ <= AVar2 * 3;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&this->childValues_,
                    (this->childValues_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  if (AVar2 != 0 && !bVar9) {
    uVar6 = 1;
    do {
      pVVar4 = Value::operator[](value,uVar6 - 1);
      if ((*(ushort *)&pVVar4->bits_ & 0xfe) == 6) {
        bVar9 = true;
        bVar5 = (byte)*(ushort *)&pVVar4->bits_;
        if ((bVar5 < 8) && ((0xc1U >> (bVar5 & 0x1f) & 1) != 0)) {
          AVar3 = Value::size(pVVar4);
          bVar9 = AVar3 != 0;
        }
      }
      else {
        bVar9 = false;
      }
    } while ((uVar6 < AVar2) && (uVar6 = uVar6 + 1, bVar9 == false));
  }
  if (bVar9 == false) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&this->childValues_,(ulong)AVar2);
    this->field_0xd8 = this->field_0xd8 | 1;
    uVar6 = AVar2 * 2 + 2;
    bVar5 = 0;
    if (AVar2 != 0) {
      lVar7 = 8;
      uVar8 = 0;
      do {
        pVVar4 = Value::operator[](value,(ArrayIndex)uVar8);
        _Var1._M_head_impl =
             (pVVar4->comments_).ptr_._M_t.
             super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
             .
             super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
             ._M_head_impl;
        if (_Var1._M_head_impl ==
            (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
             *)0x0) {
          bVar9 = false;
        }
        else {
          bVar9 = *(size_type *)((long)(_Var1._M_head_impl)->_M_elems + 8) != 0;
          if ((!bVar9) &&
             (bVar9 = *(size_type *)((long)(_Var1._M_head_impl)->_M_elems + 0x28) != 0, !bVar9)) {
            bVar9 = *(size_type *)((long)(_Var1._M_head_impl)->_M_elems + 0x48) != 0;
          }
        }
        if (bVar9) {
          bVar5 = 1;
        }
        pVVar4 = Value::operator[](value,(ArrayIndex)uVar8);
        writeValue(this,pVVar4);
        uVar6 = uVar6 + *(int *)((long)&(((this->childValues_).
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                        _M_p + lVar7);
        uVar8 = uVar8 + 1;
        lVar7 = lVar7 + 0x20;
      } while (AVar2 != uVar8);
    }
    this->field_0xd8 = this->field_0xd8 & 0xfe;
    bVar9 = (bool)(this->rightMargin_ <= uVar6 | bVar5);
  }
  return bVar9;
}

Assistant:

bool BuiltStyledStreamWriter::isMultilineArray(Value const& value) {
  ArrayIndex const size = value.size();
  bool isMultiLine = size * 3 >= rightMargin_;
  childValues_.clear();
  for (ArrayIndex index = 0; index < size && !isMultiLine; ++index) {
    Value const& childValue = value[index];
    isMultiLine = ((childValue.isArray() || childValue.isObject()) &&
                   !childValue.empty());
  }
  if (!isMultiLine) // check if line length > max line length
  {
    childValues_.reserve(size);
    addChildValues_ = true;
    ArrayIndex lineLength = 4 + (size - 1) * 2; // '[ ' + ', '*n + ' ]'
    for (ArrayIndex index = 0; index < size; ++index) {
      if (hasCommentForValue(value[index])) {
        isMultiLine = true;
      }
      writeValue(value[index]);
      lineLength += static_cast<ArrayIndex>(childValues_[index].length());
    }
    addChildValues_ = false;
    isMultiLine = isMultiLine || lineLength >= rightMargin_;
  }
  return isMultiLine;
}